

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Market.cpp
# Opt level: O0

void __thiscall Market::erase(Market *this,Order *order)

{
  bool bVar1;
  __type_conflict _Var2;
  Side SVar3;
  string *psVar4;
  pointer ppVar5;
  _Self local_90;
  _Base_ptr local_88;
  _Rb_tree_iterator<std::pair<const_double,_Order>_> local_80;
  iterator i_1;
  _Self local_60;
  _Base_ptr local_58;
  _Rb_tree_iterator<std::pair<const_double,_Order>_> local_50;
  iterator i;
  undefined1 local_38 [8];
  string id;
  Order *order_local;
  Market *this_local;
  
  id.field_2._8_8_ = order;
  psVar4 = Order::getClientID_abi_cxx11_(order);
  std::__cxx11::string::string((string *)local_38,(string *)psVar4);
  SVar3 = Order::getSide((Order *)id.field_2._8_8_);
  if (SVar3 == buy) {
    std::_Rb_tree_iterator<std::pair<const_double,_Order>_>::_Rb_tree_iterator(&local_50);
    local_58 = (_Base_ptr)
               std::
               multimap<double,_Order,_std::greater<double>,_std::allocator<std::pair<const_double,_Order>_>_>
               ::begin(&this->m_bidOrders);
    local_50._M_node = local_58;
    while( true ) {
      local_60._M_node =
           (_Base_ptr)
           std::
           multimap<double,_Order,_std::greater<double>,_std::allocator<std::pair<const_double,_Order>_>_>
           ::end(&this->m_bidOrders);
      bVar1 = std::operator!=(&local_50,&local_60);
      if (!bVar1) break;
      ppVar5 = std::_Rb_tree_iterator<std::pair<const_double,_Order>_>::operator->(&local_50);
      psVar4 = Order::getClientID_abi_cxx11_(&ppVar5->second);
      _Var2 = std::operator==(psVar4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_38);
      if (_Var2) {
        std::
        multimap<double,Order,std::greater<double>,std::allocator<std::pair<double_const,Order>>>::
        erase_abi_cxx11_((multimap<double,Order,std::greater<double>,std::allocator<std::pair<double_const,Order>>>
                          *)&this->m_bidOrders,(iterator)local_50._M_node);
        i_1._M_node._4_4_ = 1;
        goto LAB_0015ec2d;
      }
      std::_Rb_tree_iterator<std::pair<const_double,_Order>_>::operator++(&local_50);
    }
  }
  else {
    SVar3 = Order::getSide((Order *)id.field_2._8_8_);
    if (SVar3 == sell) {
      std::_Rb_tree_iterator<std::pair<const_double,_Order>_>::_Rb_tree_iterator(&local_80);
      local_88 = (_Base_ptr)
                 std::
                 multimap<double,_Order,_std::less<double>,_std::allocator<std::pair<const_double,_Order>_>_>
                 ::begin(&this->m_askOrders);
      local_80._M_node = local_88;
      while( true ) {
        local_90._M_node =
             (_Base_ptr)
             std::
             multimap<double,_Order,_std::less<double>,_std::allocator<std::pair<const_double,_Order>_>_>
             ::end(&this->m_askOrders);
        bVar1 = std::operator!=(&local_80,&local_90);
        if (!bVar1) break;
        ppVar5 = std::_Rb_tree_iterator<std::pair<const_double,_Order>_>::operator->(&local_80);
        psVar4 = Order::getClientID_abi_cxx11_(&ppVar5->second);
        _Var2 = std::operator==(psVar4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_38);
        if (_Var2) {
          std::
          multimap<double,Order,std::less<double>,std::allocator<std::pair<double_const,Order>>>::
          erase_abi_cxx11_((multimap<double,Order,std::less<double>,std::allocator<std::pair<double_const,Order>>>
                            *)&this->m_askOrders,(iterator)local_80._M_node);
          i_1._M_node._4_4_ = 1;
          goto LAB_0015ec2d;
        }
        std::_Rb_tree_iterator<std::pair<const_double,_Order>_>::operator++(&local_80);
      }
    }
  }
  i_1._M_node._4_4_ = 0;
LAB_0015ec2d:
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void Market::erase(const Order &order) {
  std::string id = order.getClientID();
  if (order.getSide() == Order::buy) {
    BidOrders::iterator i;
    for (i = m_bidOrders.begin(); i != m_bidOrders.end(); ++i) {
      if (i->second.getClientID() == id) {
        m_bidOrders.erase(i);
        return;
      }
    }
  } else if (order.getSide() == Order::sell) {
    AskOrders::iterator i;
    for (i = m_askOrders.begin(); i != m_askOrders.end(); ++i) {
      if (i->second.getClientID() == id) {
        m_askOrders.erase(i);
        return;
      }
    }
  }
}